

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

int __thiscall QDialog::exec(QDialog *this)

{
  QPointer<QEventLoop> *this_00;
  QDialogPrivate *this_01;
  bool bVar1;
  bool on;
  QPlatformDialogHelper *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QWeakPointer<QObject> local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  this_00 = &this_01->eventLoop;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar1) {
    local_58.d._0_4_ = 2;
    local_44 = 0;
    local_58.d._4_4_ = 0;
    local_58.value._0_4_ = 0;
    local_58.value._4_4_ = 0;
    uStack_48 = 0;
    local_40 = "default";
    QMessageLogger::warning((char *)&local_58,"QDialog::exec: Recursive call detected");
    iVar3 = -1;
  }
  else {
    bVar1 = QWidget::testAttribute_helper(&this->super_QWidget,WA_DeleteOnClose);
    QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,false);
    QDialogPrivate::resetModalitySetByOpen(this_01);
    on = QWidget::testAttribute_helper(&this->super_QWidget,WA_ShowModal);
    QWidget::setAttribute(&this->super_QWidget,WA_ShowModal,true);
    *(undefined4 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2ac) = 0;
    QWidget::show(&this->super_QWidget);
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.value._0_4_ = 0xaaaaaaaa;
    local_58.value._4_4_ = 0xaaaaaaaa;
    QPointer<QDialog>::QPointer<void>((QPointer<QDialog> *)&local_58,this);
    if (this_01->nativeDialogInUse == true) {
      pQVar2 = QDialogPrivate::platformHelper(this_01);
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2);
    }
    else {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QEventLoop::QEventLoop((QEventLoop *)&local_68,(QObject *)0x0);
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)&local_68);
      QEventLoop::exec(&local_68);
      QEventLoop::~QEventLoop((QEventLoop *)&local_68);
    }
    iVar3 = 0;
    if (((CONCAT44(local_58.d._4_4_,local_58.d._0_4_) != 0) &&
        (*(int *)(CONCAT44(local_58.d._4_4_,local_58.d._0_4_) + 4) != 0)) &&
       (CONCAT44(local_58.value._4_4_,local_58.value._0_4_) != 0)) {
      QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
      QWidget::setAttribute(&this->super_QWidget,WA_ShowModal,on);
      iVar3 = *(int *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2ac);
      if (this_01->nativeDialogInUse == true) {
        pQVar2 = QDialogPrivate::platformHelper(this_01);
        (**(code **)(*(long *)&this_01->super_QWidgetPrivate + 200))(this_01,iVar3,pQVar2);
      }
      if (bVar1) {
        (**(code **)(*(long *)&this->super_QWidget + 0x20))(this);
      }
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QDialog::exec()
{
    Q_D(QDialog);

    if (Q_UNLIKELY(d->eventLoop)) {
        qWarning("QDialog::exec: Recursive call detected");
        return -1;
    }

    bool deleteOnClose = testAttribute(Qt::WA_DeleteOnClose);
    setAttribute(Qt::WA_DeleteOnClose, false);

    d->resetModalitySetByOpen();

    bool wasShowModal = testAttribute(Qt::WA_ShowModal);
    setAttribute(Qt::WA_ShowModal, true);
    setResult(0);

    show();

    QPointer<QDialog> guard = this;
    if (d->nativeDialogInUse) {
        d->platformHelper()->exec();
    } else {
        QEventLoop eventLoop;
        d->eventLoop = &eventLoop;
        (void) eventLoop.exec(QEventLoop::DialogExec);
    }
    if (guard.isNull())
        return QDialog::Rejected;
    d->eventLoop = nullptr;

    setAttribute(Qt::WA_ShowModal, wasShowModal);

    int res = result();
    if (d->nativeDialogInUse)
        d->helperDone(static_cast<QDialog::DialogCode>(res), d->platformHelper());
    if (deleteOnClose)
        delete this;
    return res;
}